

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv4_address.c
# Opt level: O0

LY_ERR lyplg_type_dup_ipv4_address(ly_ctx *ctx,lyd_value *original,lyd_value *dup)

{
  anon_union_24_16_e2776397_for_lyd_value_2 *__s;
  lyd_value_ipv4_address *dup_val;
  lyd_value_ipv4_address *orig_val;
  LY_ERR ret;
  lyd_value *dup_local;
  lyd_value *original_local;
  ly_ctx *ctx_local;
  
  memset(dup,0,0x28);
  orig_val._4_4_ = lydict_insert(ctx,original->_canonical,0,&dup->_canonical);
  if (orig_val._4_4_ == LY_SUCCESS) {
    __s = &dup->field_2;
    memset(__s,0,0x10);
    if (__s == (anon_union_24_16_e2776397_for_lyd_value_2 *)0x0) {
      orig_val._4_4_ = LY_EMEM;
    }
    else {
      __s->int32 = (original->field_2).int32;
      orig_val._4_4_ =
           lydict_insert(ctx,*(char **)((long)&original->field_2 + 8),0,
                         (char **)((long)&dup->field_2 + 8));
      if (orig_val._4_4_ == LY_SUCCESS) {
        dup->realtype = original->realtype;
        return LY_SUCCESS;
      }
    }
  }
  lyplg_type_free_ipv4_address(ctx,dup);
  return orig_val._4_4_;
}

Assistant:

static LY_ERR
lyplg_type_dup_ipv4_address(const struct ly_ctx *ctx, const struct lyd_value *original, struct lyd_value *dup)
{
    LY_ERR ret;
    struct lyd_value_ipv4_address *orig_val, *dup_val;

    memset(dup, 0, sizeof *dup);

    ret = lydict_insert(ctx, original->_canonical, 0, &dup->_canonical);
    LY_CHECK_GOTO(ret, error);

    LYPLG_TYPE_VAL_INLINE_PREPARE(dup, dup_val);
    LY_CHECK_ERR_GOTO(!dup_val, ret = LY_EMEM, error);

    LYD_VALUE_GET(original, orig_val);

    memcpy(&dup_val->addr, &orig_val->addr, sizeof orig_val->addr);
    ret = lydict_insert(ctx, orig_val->zone, 0, &dup_val->zone);
    LY_CHECK_GOTO(ret, error);

    dup->realtype = original->realtype;
    return LY_SUCCESS;

error:
    lyplg_type_free_ipv4_address(ctx, dup);
    return ret;
}